

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O2

int __thiscall OpenMD::Rattle::constraintPairA(Rattle *this,ConstraintPair *consPair)

{
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  int iVar1;
  int __denom;
  Vector<double,_3U> *this_02;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double s;
  Vector3d delta;
  Vector3d velA;
  Vector3d rab;
  Vector3d fcons;
  Vector3d velB;
  Vector3d oldPosA;
  Vector3d pab;
  Vector3d posB;
  Vector3d posA;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector3d oldPosB;
  
  this_00 = consPair->consElem1_;
  this_01 = consPair->consElem2_;
  ConstraintElem::getPos((Vector3d *)&posA.super_Vector<double,_3U>,this_00);
  ConstraintElem::getPos((Vector3d *)&posB.super_Vector<double,_3U>,this_01);
  operator-(&oldPosA.super_Vector<double,_3U>,&posA.super_Vector<double,_3U>,
            &posB.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&pab.super_Vector<double,_3U>,&oldPosA.super_Vector<double,_3U>);
  Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&pab.super_Vector<double,_3U>);
  dVar3 = Vector<double,_3U>::lengthSquare(&pab.super_Vector<double,_3U>);
  dVar4 = consPair->dist2;
  dVar3 = dVar4 - dVar3;
  dVar2 = this->consTolerance_ * dVar4;
  if (ABS(dVar3) <= dVar2 + dVar2) {
    iVar1 = 1;
  }
  else {
    ConstraintElem::getPrevPos((Vector3d *)&oldPosA.super_Vector<double,_3U>,this_00);
    ConstraintElem::getPrevPos((Vector3d *)&oldPosB.super_Vector<double,_3U>,this_01);
    operator-(&delta.super_Vector<double,_3U>,&oldPosA.super_Vector<double,_3U>,
              &oldPosB.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&rab.super_Vector<double,_3U>,&delta.super_Vector<double,_3U>);
    Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&rab.super_Vector<double,_3U>);
    dVar2 = dot<double,3u>(&rab.super_Vector<double,_3U>,&pab.super_Vector<double,_3U>);
    if (dVar4 * -dVar3 <= dVar2 * dVar2) {
      auVar5._8_8_ = this_01->sd_->mass_;
      auVar5._0_8_ = this_00->sd_->mass_;
      auVar5 = divpd(_DAT_00241090,auVar5);
      dVar4 = auVar5._0_8_;
      s = auVar5._8_8_;
      operator*(&velA.super_Vector<double,_3U>,&rab.super_Vector<double,_3U>,
                dVar3 / (dVar2 * (s + dVar4 + s + dVar4)));
      Vector<double,_3U>::Vector(&delta.super_Vector<double,_3U>,&velA.super_Vector<double,_3U>);
      operator*(&velA.super_Vector<double,_3U>,dVar4,&delta.super_Vector<double,_3U>);
      Vector<double,_3U>::add(&posA.super_Vector<double,_3U>,&velA.super_Vector<double,_3U>);
      ConstraintElem::setPos(this_00,(Vector3d *)&posA.super_Vector<double,_3U>);
      operator*(&velA.super_Vector<double,_3U>,s,&delta.super_Vector<double,_3U>);
      this_02 = &posB.super_Vector<double,_3U>;
      Vector<double,_3U>::sub(this_02,&velA.super_Vector<double,_3U>);
      ConstraintElem::setPos(this_01,(Vector3d *)this_02);
      Vector<double,_3U>::div(&delta.super_Vector<double,_3U>,(int)this_02,__denom);
      ConstraintElem::getVel((Vector3d *)&velA.super_Vector<double,_3U>,this_00);
      operator*(&velB.super_Vector<double,_3U>,dVar4,&delta.super_Vector<double,_3U>);
      Vector<double,_3U>::add(&velA.super_Vector<double,_3U>,&velB.super_Vector<double,_3U>);
      ConstraintElem::setVel(this_00,(Vector3d *)&velA.super_Vector<double,_3U>);
      ConstraintElem::getVel((Vector3d *)&velB.super_Vector<double,_3U>,this_01);
      operator*(&fcons.super_Vector<double,_3U>,s,&delta.super_Vector<double,_3U>);
      Vector<double,_3U>::sub(&velB.super_Vector<double,_3U>,&fcons.super_Vector<double,_3U>);
      ConstraintElem::setVel(this_01,(Vector3d *)&velB.super_Vector<double,_3U>);
      operator*(&local_78,2.0,&delta.super_Vector<double,_3U>);
      operator/(&local_60,&local_78,this->dt_);
      Vector<double,_3U>::Vector(&fcons.super_Vector<double,_3U>,&local_60);
      dVar4 = Vector<double,_3U>::length(&fcons.super_Vector<double,_3U>);
      dVar3 = dot<double,3u>(&fcons.super_Vector<double,_3U>,&rab.super_Vector<double,_3U>);
      consPair->force_ =
           (double)((ulong)ABS(dVar4) | (ulong)dVar3 & 0x8000000000000000) + consPair->force_;
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int Rattle::constraintPairA(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d pab = posA - posB;

    // periodic boundary condition

    currentSnapshot_->wrapVector(pab);

    RealType pabsq = pab.lengthSquare();

    RealType rabsq  = consPair->getConsDistSquare();
    RealType diffsq = rabsq - pabsq;

    // the original rattle code from alan tidesley
    if (fabs(diffsq) > (consTolerance_ * rabsq * 2.0)) {
      Vector3d oldPosA = consElem1->getPrevPos();
      Vector3d oldPosB = consElem2->getPrevPos();

      Vector3d rab = oldPosA - oldPosB;

      currentSnapshot_->wrapVector(rab);

      RealType rpab   = dot(rab, pab);
      RealType rpabsq = rpab * rpab;

      if (rpabsq < (rabsq * -diffsq)) { return consFail; }

      RealType rma = 1.0 / consElem1->getMass();
      RealType rmb = 1.0 / consElem2->getMass();

      RealType gab = diffsq / (2.0 * (rma + rmb) * rpab);

      Vector3d delta = rab * gab;

      // set atom1's position
      posA += rma * delta;
      consElem1->setPos(posA);

      // set atom2's position
      posB -= rmb * delta;
      consElem2->setPos(posB);

      delta /= dt_;

      // set atom1's velocity
      Vector3d velA = consElem1->getVel();
      velA += rma * delta;
      consElem1->setVel(velA);

      // set atom2's velocity
      Vector3d velB = consElem2->getVel();
      velB -= rmb * delta;
      consElem2->setVel(velB);

      // report the constraint force back to the constraint pair:
      Vector3d fcons = 2.0 * delta / dt_;
      RealType proj  = copysign(fcons.length(), dot(fcons, rab));

      consPair->addConstraintForce(proj);
      return consSuccess;
    } else {
      return consAlready;
    }
  }